

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,String *param_5)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  StringPtr local_48;
  undefined8 *local_38;
  long local_28;
  undefined8 uStack_20;
  undefined8 *local_18;
  
  operator*<int,_bool>(&local_28,*param_2);
  operator*<int,_bool>(&local_48,param_2[1]);
  concat<kj::String,kj::StringPtr&,kj::String>
            (__return_storage_ptr__,(_ *)&local_28,(String *)(param_2 + 2),&local_48,param_5);
  sVar2 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(code **)*local_38)(local_38,pcVar1,1,sVar2,sVar2,0);
  }
  uVar4 = uStack_20;
  lVar3 = local_28;
  if (local_28 != 0) {
    local_28 = 0;
    uStack_20 = 0;
    (**(code **)*local_18)(local_18,lVar3,1,uVar4,uVar4,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}